

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# echo_client_async.cpp
# Opt level: O3

void __thiscall Client::DoWrite(Client *this)

{
  char *__s;
  size_t sVar1;
  transfer_all_t local_59;
  Client *local_58;
  mutable_buffer local_50;
  _Bind<void_(Client::*(Client_*,_std::_Placeholder<1>,_std::_Placeholder<2>))(boost::system::error_code,_unsigned_long)>
  local_40;
  
  __s = this->cin_buf_;
  do {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Enter message: ",0xf);
    std::ios::widen((char)*(undefined8 *)(std::cin + -0x18) + -8);
    std::istream::getline((char *)&std::cin,(long)__s,'\0');
    sVar1 = strlen(__s);
  } while (sVar1 == 0);
  local_50.size_ = 0x400;
  if (sVar1 < 0x400) {
    local_50.size_ = sVar1;
  }
  local_40._M_f = (offset_in_Client_to_subr)OnWrite;
  local_40._8_8_ = 0;
  local_58 = this;
  local_50.data_ = __s;
  local_40._M_bound_args.
  super__Tuple_impl<0UL,_Client_*,_std::_Placeholder<1>,_std::_Placeholder<2>_>.
  super__Head_base<0UL,_Client_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_Client_*,_std::_Placeholder<1>,_std::_Placeholder<2>_>)
       (_Tuple_impl<0UL,_Client_*,_std::_Placeholder<1>,_std::_Placeholder<2>_>)this;
  boost::asio::detail::
  initiate_async_write_buffer_sequence<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>
  ::operator()((initiate_async_write_buffer_sequence<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>
                *)&local_58,&local_40,&local_50,&local_59);
  return;
}

Assistant:

void Client::DoWrite() {
  std::size_t len = 0;
  do {
    std::cout << "Enter message: ";
    std::cin.getline(cin_buf_, BUF_SIZE);
    len = strlen(cin_buf_);
  } while (len == 0);

  // TODO: Second parameter
  // WriteHandler: void (boost::system::error_code, std::size_t)
  boost::asio::async_write(socket_,
                           boost::asio::buffer(cin_buf_, len),
                           std::bind(&Client::OnWrite, this,
                                     std::placeholders::_1,
                                     std::placeholders::_2));
}